

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleReadElfCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  char local_522 [2];
  char *local_520;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  string local_510 [8];
  string runpath;
  StringEntry *se_runpath;
  char *local_4e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  string local_4d0 [8];
  string rpath;
  StringEntry *se_rpath;
  cmELF elf;
  string local_478;
  undefined1 local_458 [8];
  ostringstream e;
  undefined1 local_2e0 [8];
  cmCAString errorArg;
  cmCAString runpathArg;
  cmCAString rpathArg;
  cmCAString fileNameArg;
  cmCAString readArg;
  cmCommandArgumentGroup group;
  cmCommandArgumentsHelper argHelper;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "READ_ELF must be called with at least three additional arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    this_00 = &group.ContainedArguments.
               super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    cmCommandArgumentsHelper::cmCommandArgumentsHelper((cmCommandArgumentsHelper *)this_00);
    cmCommandArgumentGroup::cmCommandArgumentGroup((cmCommandArgumentGroup *)&readArg.DataStart);
    cmCAString::cmCAString
              ((cmCAString *)&fileNameArg.DataStart,(cmCommandArgumentsHelper *)this_00,"READ_ELF",
               (cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString
              ((cmCAString *)&rpathArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(char *)0x0,
               (cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString
              ((cmCAString *)&runpathArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"RPATH",
               (cmCommandArgumentGroup *)&readArg.DataStart);
    cmCAString::cmCAString
              ((cmCAString *)&errorArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"RUNPATH",
               (cmCommandArgumentGroup *)&readArg.DataStart);
    cmCAString::cmCAString
              ((cmCAString *)local_2e0,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"CAPTURE_ERROR",
               (cmCommandArgumentGroup *)&readArg.DataStart);
    cmCommandArgument::Follows((cmCommandArgument *)&fileNameArg.DataStart,(cmCommandArgument *)0x0)
    ;
    cmCommandArgument::Follows
              ((cmCommandArgument *)&rpathArg.DataStart,(cmCommandArgument *)&fileNameArg.DataStart)
    ;
    cmCommandArgumentGroup::Follows
              ((cmCommandArgumentGroup *)&readArg.DataStart,(cmCommandArgument *)&rpathArg.DataStart
              );
    cmCommandArgumentsHelper::Parse
              ((cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_20,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    psVar4 = cmCAString::GetString_abi_cxx11_((cmCAString *)&rpathArg.DataStart);
    bVar2 = cmsys::SystemTools::FileExists(psVar4,true);
    if (bVar2) {
      pcVar6 = cmCAString::GetCString((cmCAString *)&rpathArg.DataStart);
      cmELF::cmELF((cmELF *)&se_rpath,pcVar6);
      cmCAString::GetString_abi_cxx11_((cmCAString *)&runpathArg.DataStart);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (rpath.field_2._8_8_ = cmELF::GetRPath((cmELF *)&se_rpath),
         (StringEntry *)rpath.field_2._8_8_ != (StringEntry *)0x0)) {
        std::__cxx11::string::string(local_4d0,(string *)rpath.field_2._8_8_);
        local_4d8._M_current = (char *)std::__cxx11::string::begin();
        local_4e0 = (char *)std::__cxx11::string::end();
        se_runpath._7_1_ = 0x3a;
        se_runpath._6_1_ = 0x3b;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_4d8,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_4e0,(char *)((long)&se_runpath + 7),(char *)((long)&se_runpath + 6));
        pcVar1 = (this->super_cmCommand).Makefile;
        psVar4 = cmCAString::GetString_abi_cxx11_((cmCAString *)&runpathArg.DataStart);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,psVar4,pcVar6);
        std::__cxx11::string::~string(local_4d0);
      }
      cmCAString::GetString_abi_cxx11_((cmCAString *)&errorArg.DataStart);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (runpath.field_2._8_8_ = cmELF::GetRunPath((cmELF *)&se_rpath),
         (StringEntry *)runpath.field_2._8_8_ != (StringEntry *)0x0)) {
        std::__cxx11::string::string(local_510,(string *)runpath.field_2._8_8_);
        local_518._M_current = (char *)std::__cxx11::string::begin();
        local_520 = (char *)std::__cxx11::string::end();
        local_522[1] = 0x3a;
        local_522[0] = ';';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_518,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_520,local_522 + 1,local_522);
        pcVar1 = (this->super_cmCommand).Makefile;
        psVar4 = cmCAString::GetString_abi_cxx11_((cmCAString *)&errorArg.DataStart);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,psVar4,pcVar6);
        std::__cxx11::string::~string(local_510);
      }
      this_local._7_1_ = 1;
      elf.ErrorMessage.field_2._12_4_ = 1;
      cmELF::~cmELF((cmELF *)&se_rpath);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
      poVar5 = std::operator<<((ostream *)local_458,"READ_ELF given FILE \"");
      psVar4 = cmCAString::GetString_abi_cxx11_((cmCAString *)&rpathArg.DataStart);
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      std::operator<<(poVar5,"\" that does not exist.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      this_local._7_1_ = 0;
      elf.ErrorMessage.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
    }
    cmCAString::~cmCAString((cmCAString *)local_2e0);
    cmCAString::~cmCAString((cmCAString *)&errorArg.DataStart);
    cmCAString::~cmCAString((cmCAString *)&runpathArg.DataStart);
    cmCAString::~cmCAString((cmCAString *)&rpathArg.DataStart);
    cmCAString::~cmCAString((cmCAString *)&fileNameArg.DataStart);
    cmCommandArgumentGroup::~cmCommandArgumentGroup((cmCommandArgumentGroup *)&readArg.DataStart);
    cmCommandArgumentsHelper::~cmCommandArgumentsHelper
              ((cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleReadElfCommand(std::vector<std::string> const& args)
{
  if (args.size() < 4) {
    this->SetError("READ_ELF must be called with at least three additional "
                   "arguments.");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg(&argHelper, "READ_ELF");
  cmCAString fileNameArg(&argHelper, nullptr);

  cmCAString rpathArg(&argHelper, "RPATH", &group);
  cmCAString runpathArg(&argHelper, "RUNPATH", &group);
  cmCAString errorArg(&argHelper, "CAPTURE_ERROR", &group);

  readArg.Follows(nullptr);
  fileNameArg.Follows(&readArg);
  group.Follows(&fileNameArg);
  argHelper.Parse(&args, nullptr);

  if (!cmSystemTools::FileExists(fileNameArg.GetString(), true)) {
    std::ostringstream e;
    e << "READ_ELF given FILE \"" << fileNameArg.GetString()
      << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fileNameArg.GetCString());

  if (!rpathArg.GetString().empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      this->Makefile->AddDefinition(rpathArg.GetString(), rpath.c_str());
    }
  }
  if (!runpathArg.GetString().empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      this->Makefile->AddDefinition(runpathArg.GetString(), runpath.c_str());
    }
  }

  return true;
#else
  std::string error = "ELF parser not available on this platform.";
  if (errorArg.GetString().empty()) {
    this->SetError(error);
    return false;
  }
  this->Makefile->AddDefinition(errorArg.GetString(), error.c_str());
  return true;
#endif
}